

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O2

void calculate_breakpoint_mask(void)

{
  uint uVar1;
  Breakpoint *pBVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  s_breakpoint_mask_0 = 0xffff;
  s_breakpoint_mask_1 = 0xffff;
  uVar4 = 0;
  uVar3 = (ulong)(uint)s_breakpoint_max_id;
  if (s_breakpoint_max_id < 1) {
    uVar3 = uVar4;
  }
  uVar5 = 0xffff;
  uVar6 = 0xffff;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    if ((~s_breakpoints[uVar4].field_0x7 & 3) == 0) {
      pBVar2 = s_breakpoints + uVar4;
      uVar1._0_2_ = pBVar2->addr;
      uVar1._2_1_ = pBVar2->bank;
      uVar1._3_1_ = pBVar2->field_0x7;
      uVar5 = uVar5 & uVar1;
      uVar6 = uVar6 & ~uVar1;
      s_breakpoint_mask_0 = (undefined2)uVar6;
      s_breakpoint_mask_1 = (undefined2)uVar5;
    }
  }
  return;
}

Assistant:

static void calculate_breakpoint_mask(void) {
  s_breakpoint_mask[0] = 0xffffu;
  s_breakpoint_mask[1] = 0xffffu;
  int id;
  for (id = 0; id < s_breakpoint_max_id; ++id) {
    Breakpoint* bp = &s_breakpoints[id];
    if (!(bp->valid && bp->enabled)) {
      continue;
    }
    s_breakpoint_mask[0] &= ~bp->addr;
    s_breakpoint_mask[1] &= bp->addr;
  }
}